

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_shape_prepare_update(JSContext *ctx,JSObject *p,JSShapeProperty **pprs)

{
  JSShapeProperty *pJVar1;
  JSShape *pJVar2;
  JSRuntime *in_RDX;
  long in_RSI;
  uint32_t idx;
  JSShape *sh;
  JSShape *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  
  uVar3 = 0;
  pJVar2 = *(JSShape **)(in_RSI + 0x18);
  if (pJVar2->is_hashed != '\0') {
    if ((pJVar2->header).ref_count == 1) {
      js_shape_hash_unlink(in_RDX,pJVar2);
      pJVar2->is_hashed = '\0';
    }
    else {
      if (in_RDX != (JSRuntime *)0x0) {
        in_stack_ffffffffffffffc8 = (JSShape *)(in_RDX->mf).js_malloc;
        pJVar1 = get_shape_prop(pJVar2);
        uVar3 = (uint)((long)in_stack_ffffffffffffffc8 - (long)pJVar1 >> 3);
      }
      pJVar2 = js_clone_shape((JSContext *)pprs,sh);
      if (pJVar2 == (JSShape *)0x0) {
        return -1;
      }
      js_free_shape((JSRuntime *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
                   );
      *(JSShape **)(in_RSI + 0x18) = pJVar2;
      if (in_RDX != (JSRuntime *)0x0) {
        pJVar1 = get_shape_prop(pJVar2);
        (in_RDX->mf).js_malloc = (_func_void_ptr_JSMallocState_ptr_size_t *)(pJVar1 + uVar3);
      }
    }
  }
  return 0;
}

Assistant:

static int js_shape_prepare_update(JSContext *ctx, JSObject *p,
                                   JSShapeProperty **pprs)
{
    JSShape *sh;
    uint32_t idx = 0;    /* prevent warning */

    sh = p->shape;
    if (sh->is_hashed) {
        if (sh->header.ref_count != 1) {
            if (pprs)
                idx = *pprs - get_shape_prop(sh);
            /* clone the shape (the resulting one is no longer hashed) */
            sh = js_clone_shape(ctx, sh);
            if (!sh)
                return -1;
            js_free_shape(ctx->rt, p->shape);
            p->shape = sh;
            if (pprs)
                *pprs = get_shape_prop(sh) + idx;
        } else {
            js_shape_hash_unlink(ctx->rt, sh);
            sh->is_hashed = FALSE;
        }
    }
    return 0;
}